

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

opj_image_t * tgatoimage(char *filename,opj_cparameters_t *parameters)

{
  int iVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  opj_image_comp_t *poVar5;
  int iVar6;
  FILE *__stream;
  size_t sVar7;
  void *__ptr;
  long lVar8;
  opj_image_t *poVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar15;
  uchar b;
  char ch;
  uchar g;
  uchar a;
  opj_image_cmptparm_t cmptparm [4];
  byte local_e9;
  byte local_e8;
  byte local_e7;
  byte local_e6;
  byte local_e5;
  uint local_e4;
  opj_cparameters_t *local_e0;
  ulong local_d8;
  ulong local_d0;
  byte local_c8 [4];
  undefined4 uStack_c4;
  uint uStack_c0;
  ushort local_bc;
  ushort local_ba;
  byte local_b8;
  byte local_b7;
  undefined4 auStack_b0 [32];
  ulong uVar14;
  
  local_e0 = parameters;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !!\n",filename);
    return (opj_image_t *)0x0;
  }
  sVar7 = fread(local_c8,0x12,1,__stream);
  if (sVar7 == 1) {
    uVar11 = (ulong)local_c8[0];
    local_e6 = local_b7;
    local_d8 = (ulong)local_bc;
    local_d0 = (ulong)local_ba;
    local_e4 = (uint)local_b8;
    if (uVar11 != 0) {
      __ptr = malloc(uVar11);
      if (__ptr == (void *)0x0) {
        tgatoimage_cold_3();
        goto LAB_00106e59;
      }
      sVar7 = fread(__ptr,uVar11,1,__stream);
      if (sVar7 == 0) {
        tgatoimage_cold_2();
        goto LAB_00106e59;
      }
      free(__ptr);
    }
    uVar13 = local_e4;
    if (local_c8[2] < 9) {
      if ((uint)(uStack_c4._3_1_ >> 3) * (uint)uStack_c4._1_2_ != 0) {
        tgatoimage_cold_4();
      }
      if ((uVar13 == 0x18) || (uVar13 == 0x20)) {
        memset(local_c8,0,0x90);
        uVar10 = local_d0;
        uVar11 = local_d8;
        uVar13 = (uVar13 == 0x20) + 3;
        uVar14 = (ulong)uVar13;
        iVar6 = (int)local_d0;
        uVar15 = (uint)local_d8;
        if ((iVar6 != 0) && ((uint)((10000000 / (local_d0 & 0xffffffff)) / uVar14) < uVar15)) {
          uVar12 = uVar14 * (local_d0 & 0xffffffff) * local_d8;
          lVar8 = ftell(__stream);
          if (0x7ffffffe < uVar12) {
            uVar12 = 0x7fffffff;
          }
          fseek(__stream,uVar12 - 1,0);
          sVar7 = fread(&local_e8,1,1,__stream);
          if (sVar7 != 1) goto LAB_00106e59;
          fseek(__stream,lVar8,0);
        }
        iVar1 = local_e0->subsampling_dx;
        iVar2 = local_e0->subsampling_dy;
        lVar8 = 0;
        do {
          *(undefined4 *)((long)auStack_b0 + lVar8) = 8;
          *(undefined4 *)((long)auStack_b0 + lVar8 + 8) = 0;
          *(int *)(local_c8 + lVar8) = iVar1;
          *(int *)((long)&uStack_c4 + lVar8) = iVar2;
          *(uint *)((long)&uStack_c0 + lVar8) = uVar15;
          *(int *)((long)&local_bc + lVar8) = iVar6;
          lVar8 = lVar8 + 0x24;
        } while ((ulong)(uVar13 * 4) * 9 != lVar8);
        poVar9 = (opj_image_t *)opj_image_create(uVar14,local_c8,1);
        if (poVar9 != (opj_image_t *)0x0) {
          OVar3 = local_e0->image_offset_x0;
          poVar9->x0 = OVar3;
          OVar4 = local_e0->image_offset_y0;
          poVar9->y0 = OVar4;
          poVar9->x1 = OVar3 + 1 + iVar1 * (uVar15 - 1);
          poVar9->y1 = OVar4 + iVar2 * (iVar6 + -1) + 1;
          if (iVar6 != 0) {
            uVar13 = 0;
            do {
              local_e0 = (opj_cparameters_t *)CONCAT44(local_e0._4_4_,uVar13);
              uVar15 = ~uVar13 + (int)uVar10;
              if ((local_e6 & 0x20) != 0) {
                uVar15 = uVar13;
              }
              iVar6 = uVar15 * (int)uVar11;
              if (local_e4 == 0x20) {
                if ((short)uVar11 != 0) {
                  lVar8 = (long)iVar6;
                  uVar11 = local_d8 & 0xffffffff;
                  do {
                    sVar7 = fread(&local_e9,1,1,__stream);
                    if (((sVar7 == 0) || (sVar7 = fread(&local_e7,1,1,__stream), sVar7 == 0)) ||
                       ((sVar7 = fread(&local_e8,1,1,__stream), sVar7 == 0 ||
                        (sVar7 = fread(&local_e5,1,1,__stream), sVar7 == 0)))) goto LAB_00106de6;
                    poVar5 = poVar9->comps;
                    poVar5->data[lVar8] = (uint)local_e8;
                    poVar5[1].data[lVar8] = (uint)local_e7;
                    poVar5[2].data[lVar8] = (uint)local_e9;
                    poVar5[3].data[lVar8] = (uint)local_e5;
                    lVar8 = lVar8 + 1;
                    uVar13 = (int)uVar11 - 1;
                    uVar11 = (ulong)uVar13;
                  } while (uVar13 != 0);
                }
              }
              else if ((short)uVar11 != 0) {
                lVar8 = (long)iVar6;
                uVar11 = local_d8 & 0xffffffff;
                do {
                  sVar7 = fread(&local_e9,1,1,__stream);
                  if (((sVar7 == 0) || (sVar7 = fread(&local_e7,1,1,__stream), sVar7 == 0)) ||
                     (sVar7 = fread(&local_e8,1,1,__stream), sVar7 == 0)) goto LAB_00106de6;
                  poVar5 = poVar9->comps;
                  poVar5->data[lVar8] = (uint)local_e8;
                  poVar5[1].data[lVar8] = (uint)local_e7;
                  poVar5[2].data[lVar8] = (uint)local_e9;
                  lVar8 = lVar8 + 1;
                  uVar13 = (int)uVar11 - 1;
                  uVar11 = (ulong)uVar13;
                } while (uVar13 != 0);
              }
              uVar13 = (int)local_e0 + 1;
              uVar10 = local_d0;
              uVar11 = local_d8;
            } while (uVar13 != (uint)local_d0);
          }
          fclose(__stream);
          return poVar9;
        }
      }
    }
    else {
      tgatoimage_cold_5();
    }
  }
  else {
    tgatoimage_cold_1();
  }
LAB_00106e59:
  fclose(__stream);
  return (opj_image_t *)0x0;
LAB_00106de6:
  fwrite("\nError: fread return a number of element different from the expected.\n",0x46,1,_stderr);
  opj_image_destroy(poVar9);
  goto LAB_00106e59;
}

Assistant:

opj_image_t* tgatoimage(const char *filename, opj_cparameters_t *parameters)
{
    FILE *f;
    opj_image_t *image;
    unsigned int image_width, image_height, pixel_bit_depth;
    unsigned int x, y;
    int flip_image = 0;
    opj_image_cmptparm_t cmptparm[4];   /* maximum 4 components */
    int numcomps;
    OPJ_COLOR_SPACE color_space;
    OPJ_BOOL mono ;
    OPJ_BOOL save_alpha;
    int subsampling_dx, subsampling_dy;
    int i;

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        return 0;
    }

    if (!tga_readheader(f, &pixel_bit_depth, &image_width, &image_height,
                        &flip_image)) {
        fclose(f);
        return NULL;
    }

    /* We currently only support 24 & 32 bit tga's ... */
    if (!((pixel_bit_depth == 24) || (pixel_bit_depth == 32))) {
        fclose(f);
        return NULL;
    }

    /* initialize image components */
    memset(&cmptparm[0], 0, 4 * sizeof(opj_image_cmptparm_t));

    mono = (pixel_bit_depth == 8) ||
           (pixel_bit_depth == 16);  /* Mono with & without alpha. */
    save_alpha = (pixel_bit_depth == 16) ||
                 (pixel_bit_depth == 32); /* Mono with alpha, or RGB with alpha */

    if (mono) {
        color_space = OPJ_CLRSPC_GRAY;
        numcomps = save_alpha ? 2 : 1;
    } else {
        numcomps = save_alpha ? 4 : 3;
        color_space = OPJ_CLRSPC_SRGB;
    }

    /* If the declared file size is > 10 MB, check that the file is big */
    /* enough to avoid excessive memory allocations */
    if (image_height != 0 &&
            image_width > 10000000U / image_height / (OPJ_UINT32)numcomps) {
        char ch;
        OPJ_UINT64 expected_file_size =
            (OPJ_UINT64)image_width * image_height * (OPJ_UINT32)numcomps;
        long curpos = ftell(f);
        if (expected_file_size > (OPJ_UINT64)INT_MAX) {
            expected_file_size = (OPJ_UINT64)INT_MAX;
        }
        fseek(f, (long)expected_file_size - 1, SEEK_SET);
        if (fread(&ch, 1, 1, f) != 1) {
            fclose(f);
            return NULL;
        }
        fseek(f, curpos, SEEK_SET);
    }

    subsampling_dx = parameters->subsampling_dx;
    subsampling_dy = parameters->subsampling_dy;

    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = 8;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx = (OPJ_UINT32)subsampling_dx;
        cmptparm[i].dy = (OPJ_UINT32)subsampling_dy;
        cmptparm[i].w = image_width;
        cmptparm[i].h = image_height;
    }

    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);

    if (!image) {
        fclose(f);
        return NULL;
    }


    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = !image->x0 ? (OPJ_UINT32)(image_width - 1)  *
                (OPJ_UINT32)subsampling_dx + 1 : image->x0 + (OPJ_UINT32)(image_width - 1)  *
                (OPJ_UINT32)subsampling_dx + 1;
    image->y1 = !image->y0 ? (OPJ_UINT32)(image_height - 1) *
                (OPJ_UINT32)subsampling_dy + 1 : image->y0 + (OPJ_UINT32)(image_height - 1) *
                (OPJ_UINT32)subsampling_dy + 1;

    /* set image data */
    for (y = 0; y < image_height; y++) {
        int index;

        if (flip_image) {
            index = (int)((image_height - y - 1) * image_width);
        } else {
            index = (int)(y * image_width);
        }

        if (numcomps == 3) {
            for (x = 0; x < image_width; x++) {
                unsigned char r, g, b;

                if (!fread(&b, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&g, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&r, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }

                image->comps[0].data[index] = r;
                image->comps[1].data[index] = g;
                image->comps[2].data[index] = b;
                index++;
            }
        } else if (numcomps == 4) {
            for (x = 0; x < image_width; x++) {
                unsigned char r, g, b, a;
                if (!fread(&b, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&g, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&r, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&a, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }

                image->comps[0].data[index] = r;
                image->comps[1].data[index] = g;
                image->comps[2].data[index] = b;
                image->comps[3].data[index] = a;
                index++;
            }
        } else {
            fprintf(stderr, "Currently unsupported bit depth : %s\n", filename);
        }
    }
    fclose(f);
    return image;
}